

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

void Acb_Ntk4CollectRing(Acb_Ntk_t *pNtk,Vec_Int_t *vStart,Vec_Int_t *vRes,Vec_Int_t *vDists)

{
  int iVar1;
  int iVar2;
  int iObj;
  int *piVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  if (0 < vStart->nSize) {
    lVar7 = 0;
    do {
      iVar1 = vStart->pArray[lVar7];
      lVar8 = (long)iVar1;
      if ((lVar8 < 0) || (vDists->nSize <= iVar1)) {
LAB_003b1622:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (iVar1 == 0) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((pNtk->vObjFans).nSize <= iVar1) goto LAB_003b1622;
      iVar2 = (pNtk->vObjFans).pArray[lVar8];
      lVar9 = (long)iVar2;
      if ((lVar9 < 0) || ((pNtk->vFanSto).nSize <= iVar2)) {
LAB_003b1603:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar2 = vDists->pArray[lVar8];
      piVar3 = (pNtk->vFanSto).pArray;
      if (0 < piVar3[lVar9]) {
        lVar10 = 0;
        do {
          if ((pNtk->vObjFans).nSize <= iVar1) goto LAB_003b1622;
          iVar6 = (pNtk->vObjFans).pArray[lVar8];
          if (((long)iVar6 < 0) || ((pNtk->vFanSto).nSize <= iVar6)) goto LAB_003b1603;
          lVar5 = lVar10 + 1;
          lVar10 = lVar10 + 1;
          Acb_Ntk4CollectAdd(pNtk,piVar3[lVar9 + lVar5],vRes,vDists,
                             (uint)(1 < (pNtk->vFanSto).pArray[iVar6]) + iVar2);
        } while (lVar10 < piVar3[lVar9]);
      }
      iVar6 = (pNtk->vFanouts).nSize;
      if (iVar6 <= iVar1) {
LAB_003b1641:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      lVar9 = 0;
      while (pVVar4 = (pNtk->vFanouts).pArray, lVar9 < pVVar4[lVar8].nSize) {
        iObj = pVVar4[lVar8].pArray[lVar9];
        if ((long)iObj < 1) {
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
        }
        if ((pNtk->vObjType).nSize <= iObj) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        if ((pNtk->vObjType).pArray[iObj] != '\0') {
          if ((pNtk->vObjFans).nSize <= iVar1) goto LAB_003b1622;
          iVar6 = (pNtk->vObjFans).pArray[lVar8];
          if (((long)iVar6 < 0) || ((pNtk->vFanSto).nSize <= iVar6)) goto LAB_003b1603;
          Acb_Ntk4CollectAdd(pNtk,iObj,vRes,vDists,
                             iVar2 + (uint)(1 < (pNtk->vFanSto).pArray[iVar6]) * 2);
          iVar6 = (pNtk->vFanouts).nSize;
        }
        lVar9 = lVar9 + 1;
        if (iVar6 <= iVar1) goto LAB_003b1641;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vStart->nSize);
  }
  return;
}

Assistant:

void Acb_Ntk4CollectRing( Acb_Ntk_t * pNtk, Vec_Int_t * vStart, Vec_Int_t * vRes, Vec_Int_t * vDists )
{
    int i, iObj;
    Vec_IntForEachEntry( vStart, iObj, i )
    {
        int k, iFanin, * pFanins, Weight = Vec_IntEntry(vDists, iObj); 
        Acb_ObjForEachFaninFast( pNtk, iObj, pFanins, iFanin, k )
            Acb_Ntk4CollectAdd( pNtk, iFanin, vRes, vDists, Weight + 1*(Acb_ObjFaninNum(pNtk, iObj) > 1) );
        Acb_ObjForEachFanout( pNtk, iObj, iFanin, k )
            Acb_Ntk4CollectAdd( pNtk, iFanin, vRes, vDists, Weight + 2*(Acb_ObjFaninNum(pNtk, iObj) > 1) );
    }
}